

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::NotMultipleOf(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                *this,int64_t actual,SValue *expected)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *actual_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_30;
  SValue *local_20;
  SValue *expected_local;
  int64_t actual_local;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_local;
  
  local_20 = expected;
  expected_local = (SValue *)actual;
  actual_local = (int64_t)this;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue(&local_30,actual);
  actual_00 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Move(&local_30);
  AddNumberError(this,kValidateErrorMultipleOf,actual_00,local_20,(_func_ValueType_ptr *)0x0);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_30);
  return;
}

Assistant:

void NotMultipleOf(int64_t actual, const SValue& expected) {
        AddNumberError(kValidateErrorMultipleOf, ValueType(actual).Move(), expected);
    }